

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_seq_parameter_set_rbsp(sps_t *sps,bs_t *b)

{
  char cVar1;
  uint32_t r_1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *useDefaultScalingMatrixFlag;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int (*scalingList) [16];
  byte *pbVar8;
  byte *pbVar9;
  uint32_t r;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int *piVar15;
  int (*paiVar16) [16];
  int (*paiVar17) [16];
  bool bVar18;
  
  memset(sps,0,0x1028);
  sps->chroma_format_idc = 1;
  uVar5 = b->bits_left;
  if (uVar5 == 8) {
    pbVar9 = b->p;
    pbVar8 = b->end;
    if (pbVar9 < pbVar8) {
      uVar3 = (uint)*pbVar9;
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      uVar5 = 7;
      goto LAB_001223ef;
    }
  }
  else {
    pbVar9 = b->p;
    pbVar8 = b->end;
  }
  uVar3 = 0;
  iVar10 = 7;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    uVar2 = 0;
    if (pbVar9 < pbVar8) {
      uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar3 = uVar3 | uVar2 << ((byte)iVar10 & 0x1f);
    bVar18 = iVar10 != 0;
    iVar10 = iVar10 + -1;
  } while (bVar18);
  uVar5 = uVar5 - 1;
LAB_001223ef:
  sps->profile_idc = uVar3;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar9 < pbVar8) {
    uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->constraint_set0_flag = uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar9 < pbVar8) {
    uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->constraint_set1_flag = uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar9 < pbVar8) {
    uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->constraint_set2_flag = uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar9 < pbVar8) {
    uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->constraint_set3_flag = uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar9 < pbVar8) {
    uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->constraint_set4_flag = uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar2 = 0;
  if (pbVar9 < pbVar8) {
    uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->constraint_set5_flag = uVar2;
  iVar10 = 0;
  do {
    iVar4 = 0;
    while (uVar5 + iVar4 != 1) {
      iVar4 = iVar4 + -1;
      if (iVar10 + -2 == iVar4) {
        uVar5 = uVar5 + iVar4;
        b->bits_left = uVar5;
        if (uVar5 != 8) goto LAB_00122559;
        goto LAB_0012253e;
      }
    }
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    iVar11 = iVar10 + -1;
    uVar5 = 8;
    iVar10 = (iVar10 - iVar4) + 1;
  } while (iVar11 != iVar4);
  b->bits_left = 8;
LAB_0012253e:
  uVar5 = 8;
  if (pbVar9 < pbVar8) {
    uVar2 = (uint)*pbVar9;
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  else {
LAB_00122559:
    uVar2 = 0;
    iVar10 = 7;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar13 = 0;
      if (pbVar9 < pbVar8) {
        uVar13 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar13 << ((byte)iVar10 & 0x1f);
      bVar18 = iVar10 != 0;
      iVar10 = iVar10 + -1;
    } while (bVar18);
  }
  sps->level_idc = uVar2;
  uVar2 = 0xffffffff;
  iVar10 = 0;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar9 < pbVar8) {
      bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar9 < pbVar8));
  if (iVar10 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar10;
    iVar11 = -3 - iVar10;
    uVar2 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar13 = 0;
      if (pbVar9 < pbVar8) {
        uVar13 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar13 << ((byte)iVar4 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar11 != -2);
  }
  sps->seq_parameter_set_id = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar2;
  if ((((uVar3 - 0x53 < 0x39) && ((0x188208808020009U >> ((ulong)(uVar3 - 0x53) & 0x3f) & 1) != 0))
      || (uVar3 == 0xf4)) || (uVar3 == 0x2c)) {
    uVar3 = 0xffffffff;
    iVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar9 < pbVar8));
    if (iVar10 == -1) {
      uVar3 = 0;
    }
    else {
      iVar4 = -2 - iVar10;
      iVar11 = -3 - iVar10;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar4 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar4 = iVar4 + -1;
      } while (iVar11 != -2);
    }
    uVar2 = 0xffffffff;
    iVar10 = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar3;
    sps->chroma_format_idc = iVar10;
    if (iVar10 == 3) {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar3 = 0;
      if (pbVar9 < pbVar8) {
        uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        uVar5 = 8;
      }
      sps->residual_colour_transform_flag = uVar3;
    }
    iVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar9 < pbVar8));
    iVar4 = 0;
    if (iVar10 == -1) {
      uVar3 = 0;
    }
    else {
      iVar11 = -2 - iVar10;
      iVar12 = -3 - iVar10;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar11 & 0x1f);
        iVar12 = iVar12 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar12 != -2);
    }
    uVar2 = 0xffffffff;
    sps->bit_depth_luma_minus8 = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar3;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar9 < pbVar8));
    uVar3 = 0;
    if (iVar4 == -1) {
      uVar2 = 0;
    }
    else {
      iVar10 = -2 - iVar4;
      iVar11 = -3 - iVar4;
      uVar2 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar13 = 0;
        if (pbVar9 < pbVar8) {
          uVar13 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar2 = uVar2 | uVar13 << ((byte)iVar10 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar10 = iVar10 + -1;
      } while (iVar11 != -2);
    }
    sps->bit_depth_chroma_minus8 = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar2;
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    if (pbVar9 < pbVar8) {
      uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      uVar5 = 8;
    }
    sps->qpprime_y_zero_transform_bypass_flag = uVar3;
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    uVar3 = 0;
    if (pbVar9 < pbVar8) {
      uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar5 = 8;
    }
    sps->seq_scaling_matrix_present_flag = uVar3;
    if (uVar3 != 0) {
      paiVar17 = sps->ScalingList4x4;
      piVar15 = sps->ScalingList8x8[5] + 0x3a;
      paiVar16 = (int (*) [16])(sps[-1].offset_for_ref_frame + 0xfd);
      uVar7 = 0;
      do {
        uVar3 = b->bits_left - 1;
        b->bits_left = uVar3;
        pbVar9 = b->p;
        uVar5 = 0;
        if (pbVar9 < b->end) {
          uVar5 = (uint)((*pbVar9 >> (uVar3 & 0x1f) & 1) != 0);
        }
        if (uVar3 == 0) {
          b->p = pbVar9 + 1;
          b->bits_left = 8;
        }
        piVar15[-0x1ec] = uVar5;
        if (uVar5 != 0) {
          if (uVar7 < 6) {
            iVar10 = 0x10;
            useDefaultScalingMatrixFlag = piVar15 + -0x180;
            scalingList = paiVar17;
          }
          else {
            iVar10 = 0x40;
            useDefaultScalingMatrixFlag = piVar15;
            scalingList = paiVar16;
          }
          read_scaling_list(b,*scalingList,iVar10,useDefaultScalingMatrixFlag);
        }
        uVar7 = uVar7 + 1;
        piVar15 = piVar15 + 1;
        paiVar17 = paiVar17 + 1;
        paiVar16 = paiVar16 + 4;
      } while (uVar7 < (ulong)(sps->chroma_format_idc == 3) * 4 + 8);
      pbVar9 = b->p;
      pbVar8 = b->end;
      uVar5 = b->bits_left;
    }
  }
  uVar3 = 0xffffffff;
  iVar10 = 0;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar9 < pbVar8) {
      bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar9 < pbVar8));
  iVar4 = 0;
  if (iVar10 == -1) {
    uVar3 = 0;
  }
  else {
    iVar11 = -2 - iVar10;
    iVar12 = -3 - iVar10;
    uVar3 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar2 = 0;
      if (pbVar9 < pbVar8) {
        uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 | uVar2 << ((byte)iVar11 & 0x1f);
      iVar12 = iVar12 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar12 != -2);
  }
  uVar2 = 0xffffffff;
  sps->log2_max_frame_num_minus4 = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar3;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar9 < pbVar8) {
      bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar4 = iVar4 + -1;
  } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar9 < pbVar8));
  if (iVar4 == -1) {
    uVar3 = 0;
  }
  else {
    iVar10 = -2 - iVar4;
    iVar11 = -3 - iVar4;
    uVar3 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar2 = 0;
      if (pbVar9 < pbVar8) {
        uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 | uVar2 << ((byte)iVar10 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar10 = iVar10 + -1;
    } while (iVar11 != -2);
  }
  uVar2 = -1 << (~(byte)iVar4 & 0x1f);
  iVar10 = ~uVar2 + uVar3;
  sps->pic_order_cnt_type = iVar10;
  if (iVar10 == 1) {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    uVar3 = 0;
    if (pbVar9 < pbVar8) {
      uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      uVar5 = 8;
    }
    sps->delta_pic_order_always_zero_flag = uVar3;
    uVar3 = 0xffffffff;
    iVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar9 < pbVar8));
    iVar4 = 0;
    if (iVar10 == -1) {
      uVar3 = 0;
    }
    else {
      iVar11 = -2 - iVar10;
      iVar12 = -3 - iVar10;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar11 & 0x1f);
        iVar12 = iVar12 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar12 != -2);
    }
    uVar13 = 0xffffffff;
    uVar14 = -1 << (~(byte)iVar10 & 0x1f);
    uVar2 = ~uVar14 + uVar3;
    iVar10 = -((int)uVar2 >> 1);
    if ((uVar2 & 1) != 0) {
      iVar10 = (int)(uVar3 - uVar14) >> 1;
    }
    sps->offset_for_non_ref_pic = iVar10;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar13 = uVar13 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar18 & uVar13 < 0x20)) && (pbVar9 < pbVar8));
    iVar10 = 0;
    if (iVar4 == -1) {
      uVar3 = 0;
    }
    else {
      iVar11 = -2 - iVar4;
      iVar12 = -3 - iVar4;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar11 & 0x1f);
        iVar12 = iVar12 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar12 != -2);
    }
    uVar13 = 0xffffffff;
    uVar14 = -1 << (~(byte)iVar4 & 0x1f);
    uVar2 = ~uVar14 + uVar3;
    iVar4 = -((int)uVar2 >> 1);
    if ((uVar2 & 1) != 0) {
      iVar4 = (int)(uVar3 - uVar14) >> 1;
    }
    sps->offset_for_top_to_bottom_field = iVar4;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar13 = uVar13 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar18 & uVar13 < 0x20)) && (pbVar9 < pbVar8));
    if (iVar10 == -1) {
      uVar3 = 0;
    }
    else {
      iVar4 = -2 - iVar10;
      iVar11 = -3 - iVar10;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar4 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar4 = iVar4 + -1;
      } while (iVar11 != -2);
    }
    uVar2 = ~(-1 << (~(byte)iVar10 & 0x1f));
    uVar13 = uVar2 + uVar3;
    sps->num_ref_frames_in_pic_order_cnt_cycle = uVar13;
    if (uVar13 != 0 && SCARRY4(uVar2,uVar3) == (int)uVar13 < 0) {
      uVar7 = 0;
      do {
        uVar5 = b->bits_left;
        uVar3 = 0xffffffff;
        iVar10 = -2;
        do {
          iVar4 = iVar10;
          uVar2 = uVar3;
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          bVar18 = true;
          if (pbVar9 < pbVar8) {
            bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
          }
          if (uVar5 == 0) {
            pbVar9 = pbVar9 + 1;
            b->p = pbVar9;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar3 = uVar2 + 1;
        } while (((bool)(bVar18 & uVar3 < 0x20)) && (iVar10 = iVar4 + 1, pbVar9 < pbVar8));
        uVar14 = 0;
        if (uVar3 != 0) {
          do {
            uVar5 = uVar5 - 1;
            b->bits_left = uVar5;
            uVar6 = 0;
            if (pbVar9 < pbVar8) {
              uVar6 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
            }
            if (uVar5 == 0) {
              pbVar9 = pbVar9 + 1;
              b->p = pbVar9;
              b->bits_left = 8;
              uVar5 = 8;
            }
            uVar14 = uVar14 | uVar6 << ((byte)uVar2 & 0x1f);
            uVar2 = uVar2 - 1;
            iVar4 = iVar4 + -1;
          } while (iVar4 != -2);
        }
        uVar3 = -1 << ((byte)uVar3 & 0x1f);
        uVar5 = ~uVar3 + uVar14;
        iVar10 = -((int)uVar5 >> 1);
        if ((uVar5 & 1) != 0) {
          iVar10 = (int)(uVar14 - uVar3) >> 1;
        }
        sps->offset_for_ref_frame[uVar7] = iVar10;
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar13);
      uVar5 = b->bits_left;
    }
  }
  else if (iVar10 == 0) {
    iVar10 = (uVar3 - uVar2) + -4;
    do {
      iVar4 = iVar10;
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      iVar10 = iVar4 + 1;
    } while (((bool)(bVar18 & iVar4 + 3U < 0x20)) && (pbVar9 < pbVar8));
    cVar1 = (char)iVar10;
    uVar3 = 0;
    if (iVar10 != -2) {
      iVar4 = iVar4 + 2;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar4 & 0x1f);
        iVar10 = iVar10 + -1;
        iVar4 = iVar4 + -1;
      } while (iVar10 != -2);
    }
    sps->log2_max_pic_order_cnt_lsb_minus4 = ~(-1 << (cVar1 + 2U & 0x1f)) + uVar3;
  }
  pbVar9 = b->p;
  uVar3 = 0xffffffff;
  iVar10 = 0;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar9 < pbVar8) {
      bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar9 < pbVar8));
  uVar3 = 0;
  if (iVar10 == -1) {
    uVar2 = 0;
  }
  else {
    iVar4 = -2 - iVar10;
    iVar11 = -3 - iVar10;
    uVar2 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar13 = 0;
      if (pbVar9 < pbVar8) {
        uVar13 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar13 << ((byte)iVar4 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar11 != -2);
  }
  sps->num_ref_frames = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  if (pbVar9 < pbVar8) {
    uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->gaps_in_frame_num_value_allowed_flag = uVar3;
  uVar3 = 0xffffffff;
  iVar10 = 0;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar9 < pbVar8) {
      bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar9 < pbVar8));
  iVar4 = 0;
  if (iVar10 == -1) {
    uVar3 = 0;
  }
  else {
    iVar11 = -2 - iVar10;
    iVar12 = -3 - iVar10;
    uVar3 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar2 = 0;
      if (pbVar9 < pbVar8) {
        uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 | uVar2 << ((byte)iVar11 & 0x1f);
      iVar12 = iVar12 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar12 != -2);
  }
  uVar2 = 0xffffffff;
  sps->pic_width_in_mbs_minus1 = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar3;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    bVar18 = true;
    if (pbVar9 < pbVar8) {
      bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar2 = uVar2 + 1;
    iVar4 = iVar4 + -1;
  } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar9 < pbVar8));
  uVar3 = 0;
  if (iVar4 == -1) {
    uVar2 = 0;
  }
  else {
    iVar10 = -2 - iVar4;
    iVar11 = -3 - iVar4;
    uVar2 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar13 = 0;
      if (pbVar9 < pbVar8) {
        uVar13 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 | uVar13 << ((byte)iVar10 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar10 = iVar10 + -1;
    } while (iVar11 != -2);
  }
  sps->pic_height_in_map_units_minus1 = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar2;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  pbVar8 = b->end;
  if (pbVar9 < pbVar8) {
    uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->frame_mbs_only_flag = uVar3;
  if (uVar3 == 0) {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    uVar3 = 0;
    if (pbVar9 < pbVar8) {
      uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar9 = pbVar9 + 1;
      b->p = pbVar9;
      uVar5 = 8;
    }
    sps->mb_adaptive_frame_field_flag = uVar3;
  }
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar3 = 0;
  if (pbVar9 < pbVar8) {
    uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->direct_8x8_inference_flag = uVar3;
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar3 = 0;
  if (pbVar9 < pbVar8) {
    uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    pbVar9 = pbVar9 + 1;
    b->p = pbVar9;
    uVar5 = 8;
  }
  sps->frame_cropping_flag = uVar3;
  if (uVar3 != 0) {
    uVar3 = 0xffffffff;
    iVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar18 & uVar3 < 0x20)) && (pbVar9 < pbVar8));
    iVar4 = 0;
    if (iVar10 == -1) {
      uVar3 = 0;
    }
    else {
      iVar11 = -2 - iVar10;
      iVar12 = -3 - iVar10;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar11 & 0x1f);
        iVar12 = iVar12 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar12 != -2);
    }
    uVar2 = 0xffffffff;
    sps->frame_crop_left_offset = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar3;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar9 < pbVar8));
    iVar10 = 0;
    if (iVar4 == -1) {
      uVar3 = 0;
    }
    else {
      iVar11 = -2 - iVar4;
      iVar12 = -3 - iVar4;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar11 & 0x1f);
        iVar12 = iVar12 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar12 != -2);
    }
    uVar2 = 0xffffffff;
    sps->frame_crop_right_offset = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar9 < pbVar8));
    iVar4 = 0;
    if (iVar10 == -1) {
      uVar3 = 0;
    }
    else {
      iVar11 = -2 - iVar10;
      iVar12 = -3 - iVar10;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar11 & 0x1f);
        iVar12 = iVar12 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar12 != -2);
    }
    uVar2 = 0xffffffff;
    sps->frame_crop_top_offset = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar3;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      bVar18 = true;
      if (pbVar9 < pbVar8) {
        bVar18 = (*pbVar9 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar9 = pbVar9 + 1;
        b->p = pbVar9;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar2 = uVar2 + 1;
      iVar4 = iVar4 + -1;
    } while (((bool)(bVar18 & uVar2 < 0x20)) && (pbVar9 < pbVar8));
    if (iVar4 == -1) {
      uVar3 = 0;
    }
    else {
      iVar10 = -2 - iVar4;
      iVar11 = -3 - iVar4;
      uVar3 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar2 = 0;
        if (pbVar9 < pbVar8) {
          uVar2 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar3 = uVar3 | uVar2 << ((byte)iVar10 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar10 = iVar10 + -1;
      } while (iVar11 != -2);
    }
    sps->frame_crop_bottom_offset = ~(-1 << (~(byte)iVar4 & 0x1f)) + uVar3;
  }
  uVar5 = uVar5 - 1;
  b->bits_left = uVar5;
  uVar3 = 0;
  if (pbVar9 < pbVar8) {
    uVar3 = (uint)((*pbVar9 >> (uVar5 & 0x1f) & 1) != 0);
  }
  if (uVar5 == 0) {
    b->p = pbVar9 + 1;
    b->bits_left = 8;
  }
  sps->vui_parameters_present_flag = uVar3;
  if (uVar3 == 0) {
    return;
  }
  read_vui_parameters(sps,b);
  return;
}

Assistant:

void read_seq_parameter_set_rbsp(sps_t* sps, bs_t* b)
{
    int i;

    if( 1 )
    {
        memset(sps, 0, sizeof(sps_t));
        sps->chroma_format_idc = 1; 
    }
 
    sps->profile_idc = bs_read_u8(b);
    sps->constraint_set0_flag = bs_read_u1(b);
    sps->constraint_set1_flag = bs_read_u1(b);
    sps->constraint_set2_flag = bs_read_u1(b);
    sps->constraint_set3_flag = bs_read_u1(b);
    sps->constraint_set4_flag = bs_read_u1(b);
    sps->constraint_set5_flag = bs_read_u1(b);
    /* reserved_zero_2bits */ bs_skip_u(b, 2);
    sps->level_idc = bs_read_u8(b);
    sps->seq_parameter_set_id = bs_read_ue(b);

    if( sps->profile_idc == 100 || sps->profile_idc == 110 ||
        sps->profile_idc == 122 || sps->profile_idc == 244 ||
        sps->profile_idc == 44 || sps->profile_idc == 83 ||
        sps->profile_idc == 86 || sps->profile_idc == 118 ||
        sps->profile_idc == 128 || sps->profile_idc == 138 ||
        sps->profile_idc == 139 || sps->profile_idc == 134
       )
    {
        sps->chroma_format_idc = bs_read_ue(b);
        if( sps->chroma_format_idc == 3 )
        {
            sps->residual_colour_transform_flag = bs_read_u1(b);
        }
        sps->bit_depth_luma_minus8 = bs_read_ue(b);
        sps->bit_depth_chroma_minus8 = bs_read_ue(b);
        sps->qpprime_y_zero_transform_bypass_flag = bs_read_u1(b);
        sps->seq_scaling_matrix_present_flag = bs_read_u1(b);
        if( sps->seq_scaling_matrix_present_flag )
        {
            for( i = 0; i < ((sps->chroma_format_idc != 3) ? 8 : 12); i++ )
            {
                sps->seq_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( sps->seq_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, sps->ScalingList4x4[ i ], 16,
                                                 &( sps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_scaling_list( b, sps->ScalingList8x8[ i - 6 ], 64,
                                                 &( sps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
    }
    sps->log2_max_frame_num_minus4 = bs_read_ue(b);
    sps->pic_order_cnt_type = bs_read_ue(b);
    if( sps->pic_order_cnt_type == 0 )
    {
        sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b);
    }
    else if( sps->pic_order_cnt_type == 1 )
    {
        sps->delta_pic_order_always_zero_flag = bs_read_u1(b);
        sps->offset_for_non_ref_pic = bs_read_se(b);
        sps->offset_for_top_to_bottom_field = bs_read_se(b);
        sps->num_ref_frames_in_pic_order_cnt_cycle = bs_read_ue(b);
        for( i = 0; i < sps->num_ref_frames_in_pic_order_cnt_cycle; i++ )
        {
            sps->offset_for_ref_frame[ i ] = bs_read_se(b);
        }
    }
    sps->num_ref_frames = bs_read_ue(b);
    sps->gaps_in_frame_num_value_allowed_flag = bs_read_u1(b);
    sps->pic_width_in_mbs_minus1 = bs_read_ue(b);
    sps->pic_height_in_map_units_minus1 = bs_read_ue(b);
    sps->frame_mbs_only_flag = bs_read_u1(b);
    if( !sps->frame_mbs_only_flag )
    {
        sps->mb_adaptive_frame_field_flag = bs_read_u1(b);
    }
    sps->direct_8x8_inference_flag = bs_read_u1(b);
    sps->frame_cropping_flag = bs_read_u1(b);
    if( sps->frame_cropping_flag )
    {
        sps->frame_crop_left_offset = bs_read_ue(b);
        sps->frame_crop_right_offset = bs_read_ue(b);
        sps->frame_crop_top_offset = bs_read_ue(b);
        sps->frame_crop_bottom_offset = bs_read_ue(b);
    }
    sps->vui_parameters_present_flag = bs_read_u1(b);
    if( sps->vui_parameters_present_flag )
    {
        read_vui_parameters(sps, b);
    }
}